

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facade_test.cc
# Opt level: O0

int main(void)

{
  bool bVar1;
  Facade *this;
  Database *this_00;
  Cache *this_01;
  bool cache_connected;
  Cache *cache;
  bool db_connected;
  Database *db;
  Facade *facade;
  
  this = (Facade *)operator_new(0x10);
  Facade::Facade(this);
  Facade::start(this);
  this_00 = (Database *)operator_new(1);
  bVar1 = Database::isConnected(this_00);
  if (!bVar1) {
    __assert_fail("db_connected == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/facade_test.cc"
                  ,0xd,"int main()");
  }
  this_01 = (Cache *)operator_new(1);
  bVar1 = Cache::isConnected(this_01);
  if (bVar1) {
    if (this_00 != (Database *)0x0) {
      operator_delete(this_00,1);
    }
    if (this_01 != (Cache *)0x0) {
      operator_delete(this_01,1);
    }
    return 0;
  }
  __assert_fail("cache_connected == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/structural/facade_test.cc"
                ,0x11,"int main()");
}

Assistant:

int main() {
  Facade* facade = new Facade;
  facade->start();

  Database* db = new Database;
  bool db_connected = db->isConnected();
  assert(db_connected == true);

  Cache* cache = new Cache;
  bool cache_connected = cache->isConnected();
  assert(cache_connected == true);

  delete db;
  delete cache;
}